

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.H
# Opt level: O2

void __thiscall amrex::FabArrayBase::CacheStats::print(CacheStats *this)

{
  ostringstream *poVar1;
  ostream *os_;
  Print *pPVar2;
  Print local_1a0;
  
  os_ = OutStream();
  Print::Print(&local_1a0,-1,os_);
  poVar1 = &local_1a0.ss;
  std::operator<<((ostream *)poVar1,"### ");
  std::operator<<((ostream *)poVar1,(string *)&this->name);
  std::operator<<((ostream *)poVar1," ###\n");
  std::operator<<((ostream *)poVar1,"    tot # of builds  : ");
  pPVar2 = Print::operator<<(&local_1a0,&this->nbuild);
  std::operator<<((ostream *)&pPVar2->ss,"\n");
  std::operator<<((ostream *)&pPVar2->ss,"    tot # of erasures: ");
  pPVar2 = Print::operator<<(pPVar2,&this->nerase);
  std::operator<<((ostream *)&pPVar2->ss,"\n");
  std::operator<<((ostream *)&pPVar2->ss,"    tot # of uses    : ");
  pPVar2 = Print::operator<<(pPVar2,&this->nuse);
  std::operator<<((ostream *)&pPVar2->ss,"\n");
  std::operator<<((ostream *)&pPVar2->ss,"    max cache size   : ");
  pPVar2 = Print::operator<<(pPVar2,&this->maxsize);
  std::operator<<((ostream *)&pPVar2->ss,"\n");
  std::operator<<((ostream *)&pPVar2->ss,"    max # of uses    : ");
  pPVar2 = Print::operator<<(pPVar2,&this->maxuse);
  std::operator<<((ostream *)&pPVar2->ss,"\n");
  Print::~Print(&local_1a0);
  return;
}

Assistant:

void print () {
            amrex::Print(Print::AllProcs) << "### " << name << " ###\n"
                                          << "    tot # of builds  : " << nbuild  << "\n"
                                          << "    tot # of erasures: " << nerase  << "\n"
                                          << "    tot # of uses    : " << nuse    << "\n"
                                          << "    max cache size   : " << maxsize << "\n"
                                          << "    max # of uses    : " << maxuse  << "\n";
        }